

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O3

int Js(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  sunrealtype c;
  sunrealtype c_00;
  
  c = (sunrealtype)SUNMatZero(J);
  LaplaceMatrix(c,J,(UserData)user_data);
  AdvectionJac(c_00,J,(UserData)user_data);
  return 0;
}

Assistant:

static int Js(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data         */
  SUNMatZero(J);                        /* Initialize Jacobian to zero */

  /* Fill in the Laplace matrix */
  LaplaceMatrix(SUN_RCONST(1.0), J, udata);

  /* Add Jacobian of the advection terms  */
  AdvectionJac(SUN_RCONST(1.0), J, udata);

  /* Return with success */
  return 0;
}